

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.cpp
# Opt level: O2

void __thiscall
cbtGImpactMeshShapePart::calculateLocalInertia
          (cbtGImpactMeshShapePart *this,cbtScalar mass,cbtVector3 *inertia)

{
  uint vertex_index;
  float fVar1;
  undefined1 auVar3 [56];
  undefined1 auVar2 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [56];
  cbtVector3 cVar6;
  cbtVector3 local_38;
  
  (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x1c])();
  auVar4 = ZEXT464((uint)mass);
  inertia->m_floats[0] = 0.0;
  inertia->m_floats[1] = 0.0;
  inertia->m_floats[2] = 0.0;
  inertia->m_floats[3] = 0.0;
  vertex_index = (this->m_primitive_manager).numverts;
  fVar1 = (float)(int)vertex_index;
  while( true ) {
    vertex_index = vertex_index - 1;
    auVar5 = auVar4._8_56_;
    if (vertex_index == 0xffffffff) break;
    TrimeshPrimitiveManager::get_vertex(&this->m_primitive_manager,vertex_index,&local_38);
    auVar3 = (undefined1  [56])0x0;
    cVar6 = gim_get_point_inertia(&local_38,mass / fVar1);
    auVar4._0_8_ = cVar6.m_floats._8_8_;
    auVar4._8_56_ = auVar5;
    auVar2._0_8_ = cVar6.m_floats._0_8_;
    auVar2._8_56_ = auVar3;
    local_38.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar2._0_16_,auVar4._0_16_);
    cbtVector3::operator+=(inertia,&local_38);
  }
  (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x1d])(this);
  return;
}

Assistant:

void cbtGImpactMeshShapePart::calculateLocalInertia(cbtScalar mass, cbtVector3& inertia) const
{
	lockChildShapes();

#ifdef CALC_EXACT_INERTIA
	inertia.setValue(0.f, 0.f, 0.f);

	int i = this->getVertexCount();
	cbtScalar pointmass = mass / cbtScalar(i);

	while (i--)
	{
		cbtVector3 pointintertia;
		this->getVertex(i, pointintertia);
		pointintertia = gim_get_point_inertia(pointintertia, pointmass);
		inertia += pointintertia;
	}

#else

	// Calc box inertia

	cbtScalar lx = m_localAABB.m_max[0] - m_localAABB.m_min[0];
	cbtScalar ly = m_localAABB.m_max[1] - m_localAABB.m_min[1];
	cbtScalar lz = m_localAABB.m_max[2] - m_localAABB.m_min[2];
	const cbtScalar x2 = lx * lx;
	const cbtScalar y2 = ly * ly;
	const cbtScalar z2 = lz * lz;
	const cbtScalar scaledmass = mass * cbtScalar(0.08333333);

	inertia = scaledmass * (cbtVector3(y2 + z2, x2 + z2, x2 + y2));

#endif

	unlockChildShapes();
}